

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetInputMessageCallbackImpl
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *inputName,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC eventHandlerCallback,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX eventHandlerCallbackEx,void *userContextCallback,
          void *userContextCallbackEx,size_t userContextCallbackExLength)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LIST_ITEM_HANDLE pLVar3;
  bool bVar4;
  undefined4 uVar5;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  _Bool registered_with_transport_handler;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallbackEx_local;
  void *userContextCallback_local;
  IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX eventHandlerCallbackEx_local;
  IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC eventHandlerCallback_local;
  char *inputName_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetInputMessageCallbackImpl",0xcad,1,
                "Invalid argument - iotHubClientHandle=%p, inputName=%p",0,inputName);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else if ((eventHandlerCallback == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0) &&
          (eventHandlerCallbackEx == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0)) {
    l._4_4_ = remove_event_unsubscribe_if_needed(iotHubClientHandle,inputName);
  }
  else {
    bVar4 = false;
    if (iotHubClientHandle->event_callbacks != (SINGLYLINKEDLIST_HANDLE)0x0) {
      pLVar3 = singlylinkedlist_get_head_item(iotHubClientHandle->event_callbacks);
      bVar4 = pLVar3 != (LIST_ITEM_HANDLE)0x0;
    }
    l._4_4_ = create_event_handler_callback
                        (iotHubClientHandle,inputName,eventHandlerCallback,eventHandlerCallbackEx,
                         userContextCallback,userContextCallbackEx,userContextCallbackExLength);
    uVar5 = (undefined4)(userContextCallbackExLength >> 0x20);
    if (l._4_4_ == IOTHUB_CLIENT_OK) {
      if ((bVar4) ||
         (iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe_InputQueue)
                            (iotHubClientHandle->deviceHandle), iVar1 == 0)) {
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_SetInputMessageCallbackImpl",0xcc0,1,
                    "IoTHubTransport_Subscribe_InputQueue failed");
        }
        delete_event_callback_list(iotHubClientHandle);
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SetInputMessageCallbackImpl",0xcbc,1,
                  "create_event_handler_callback call failed, error = %d",CONCAT44(uVar5,l._4_4_));
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetInputMessageCallbackImpl(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* inputName, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC eventHandlerCallback, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX eventHandlerCallbackEx, void *userContextCallback, void *userContextCallbackEx, size_t userContextCallbackExLength)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        LogError("Invalid argument - iotHubClientHandle=%p, inputName=%p", iotHubClientHandle, inputName);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if ((eventHandlerCallback == NULL) && (eventHandlerCallbackEx == NULL))
        {
            result = (IOTHUB_CLIENT_RESULT)remove_event_unsubscribe_if_needed(handleData, inputName);
        }
        else
        {
            bool registered_with_transport_handler = (handleData->event_callbacks != NULL) && (singlylinkedlist_get_head_item(handleData->event_callbacks) != NULL);
            if ((result = (IOTHUB_CLIENT_RESULT)create_event_handler_callback(handleData, inputName, eventHandlerCallback, eventHandlerCallbackEx, userContextCallback, userContextCallbackEx, userContextCallbackExLength)) != IOTHUB_CLIENT_OK)
            {
                LogError("create_event_handler_callback call failed, error = %d", result);
            }
            else if (!registered_with_transport_handler && (handleData->IoTHubTransport_Subscribe_InputQueue(handleData->deviceHandle) != 0))
            {
                LogError("IoTHubTransport_Subscribe_InputQueue failed");
                delete_event_callback_list(handleData);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
    }
    return result;

}